

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

_Bool array_container_select
                (array_container_t *container,uint32_t *start_rank,uint32_t rank,uint32_t *element)

{
  bool bVar1;
  int iVar2;
  uint *in_RCX;
  uint in_EDX;
  int *in_RSI;
  array_container_t *in_RDI;
  int card;
  
  iVar2 = array_container_cardinality(in_RDI);
  bVar1 = in_EDX < (uint)(*in_RSI + iVar2);
  if (bVar1) {
    *in_RCX = (uint)in_RDI->array[in_EDX - *in_RSI];
  }
  else {
    *in_RSI = iVar2 + *in_RSI;
  }
  return bVar1;
}

Assistant:

static inline bool array_container_select(const array_container_t *container,
                                          uint32_t *start_rank, uint32_t rank,
                                          uint32_t *element) {
    int card = array_container_cardinality(container);
    if (*start_rank + card <= rank) {
        *start_rank += card;
        return false;
    } else {
        *element = container->array[rank - *start_rank];
        return true;
    }
}